

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeForJS.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeForJSPass::rewritePopcntEqualOne(OptimizeForJSPass *this,Expression *expr)

{
  UnaryOp UVar1;
  Type type;
  undefined4 uVar2;
  Unary *pUVar3;
  Unary *this_00;
  Expression *pEVar4;
  Expression *pEVar5;
  Const *pCVar6;
  Binary *pBVar7;
  Binary *this_01;
  MixedArena *this_02;
  Literal local_78;
  Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_> *local_60;
  undefined1 local_58 [8];
  Localizer temp;
  Builder local_40;
  Builder builder;
  
  type.id = (expr->type).id;
  if (type.id < 7) {
    UVar1 = *(UnaryOp *)(&DAT_00b7ddc0 + type.id * 4);
    local_60 = &(this->
                super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
                ).
                super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
                .
                super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
    ;
    Localizer::Localizer
              ((Localizer *)local_58,expr,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
               .super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
               .currFunction,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
               .super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
               .currModule);
    local_40.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
         ).super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>.
         super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>.
         currModule;
    this_02 = &(local_40.wasm)->allocator;
    pUVar3 = (Unary *)MixedArena::allocSpace(this_02,0x20,8);
    (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar3->op = UVar1;
    pUVar3->value = (Expression *)temp._0_8_;
    temp.expr._4_4_ = UVar1;
    Unary::finalize(pUVar3);
    this_00 = (Unary *)MixedArena::allocSpace(this_02,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_00->op = EqZInt32;
    this_00->value = (Expression *)pUVar3;
    Unary::finalize(this_00);
    uVar2 = local_58._0_4_;
    if ((0x73U >> ((uint)type.id & 0x1f) & 1) == 0) {
      if ((uint)type.id == 2) {
        pEVar4 = (Expression *)MixedArena::allocSpace(this_02,0x18,8);
        pEVar4->_id = LocalGetId;
        pEVar4[1]._id = uVar2;
        (pEVar4->type).id = type.id;
        builder.wasm._0_4_ = SubInt32;
        builder.wasm._4_4_ = AndInt32;
      }
      else {
        pEVar4 = (Expression *)MixedArena::allocSpace(this_02,0x18,8);
        pEVar4->_id = LocalGetId;
        pEVar4[1]._id = uVar2;
        (pEVar4->type).id = type.id;
        builder.wasm._0_4_ = SubInt64;
        builder.wasm._4_4_ = AndInt64;
      }
    }
    else {
      pEVar4 = (Expression *)MixedArena::allocSpace(this_02,0x18,8);
      pEVar4->_id = LocalGetId;
      pEVar4[1]._id = uVar2;
      (pEVar4->type).id = type.id;
      switch(type.id) {
      default:
        builder.wasm._4_4_ = InvalidBinary;
        builder.wasm._0_4_ = InvalidBinary;
        break;
      case 2:
        builder.wasm._4_4_ = InvalidBinary;
        builder.wasm._0_4_ = SubInt32;
        break;
      case 3:
        builder.wasm._4_4_ = InvalidBinary;
        builder.wasm._0_4_ = SubInt64;
        break;
      case 4:
        builder.wasm._4_4_ = InvalidBinary;
        builder.wasm._0_4_ = SubFloat32;
        break;
      case 5:
        builder.wasm._4_4_ = InvalidBinary;
        builder.wasm._0_4_ = SubFloat64;
      }
    }
    pEVar5 = (Expression *)MixedArena::allocSpace(this_02,0x18,8);
    pEVar5->_id = LocalGetId;
    pEVar5[1]._id = local_58._0_4_;
    (pEVar5->type).id = type.id;
    Literal::makeOne(&local_78,type);
    pCVar6 = Builder::makeConst(&local_40,&local_78);
    pBVar7 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar7->op = (BinaryOp)builder.wasm;
    pBVar7->left = pEVar5;
    pBVar7->right = (Expression *)pCVar6;
    Binary::finalize(pBVar7);
    this_01 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = builder.wasm._4_4_;
    this_01->left = pEVar4;
    this_01->right = (Expression *)pBVar7;
    Binary::finalize(this_01);
    pUVar3 = (Unary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
    (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar3->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar3->op = temp.expr._4_4_;
    pUVar3->value = (Expression *)this_01;
    Unary::finalize(pUVar3);
    pBVar7 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar7->op = AndInt32;
    pBVar7->left = (Expression *)this_00;
    pBVar7->right = (Expression *)pUVar3;
    Binary::finalize(pBVar7);
    Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>::replaceCurrent
              (local_60,(Expression *)pBVar7);
    Literal::~Literal(&local_78);
    return;
  }
  __assert_fail("isBasic() && \"Basic type expected\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                ,0xc6,"BasicType wasm::Type::getBasic() const");
}

Assistant:

void rewritePopcntEqualOne(Expression* expr) {
    // popcnt(x) == 1   ==>   !!x & !(x & (x - 1))
    using namespace Abstract;

    Type type = expr->type;

    UnaryOp eqzOp = getUnary(type, EqZ);
    Localizer temp(expr, getFunction(), getModule());
    Builder builder(*getModule());

    replaceCurrent(builder.makeBinary(
      AndInt32,
      builder.makeUnary(EqZInt32, builder.makeUnary(eqzOp, temp.expr)),
      builder.makeUnary(
        eqzOp,
        builder.makeBinary(
          getBinary(type, And),
          builder.makeLocalGet(temp.index, type),
          builder.makeBinary(
            getBinary(type, Sub),
            builder.makeLocalGet(temp.index, type),
            builder.makeConst(Literal::makeOne(type.getBasic())))))));
  }